

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::getName_abi_cxx11_
          (string *__return_storage_ptr__,ThreeAxisForceTorqueContactSensor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->pimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string ThreeAxisForceTorqueContactSensor::getName() const
{
    return this->pimpl->name;
}